

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O1

bool __thiscall
Assimp::Ogre::OgreImporter::ReadTechnique
          (OgreImporter *this,string *techniqueName,stringstream *ss,aiMaterial *material)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  char cVar2;
  int iVar3;
  Logger *pLVar4;
  undefined8 unaff_RBP;
  ulong uVar5;
  string *psVar7;
  long lVar8;
  _Alloc_hider _Var9;
  string passName;
  string linePart;
  string partPass;
  string local_220;
  undefined1 *local_200;
  size_t local_1f8;
  undefined1 local_1f0;
  undefined7 uStack_1ef;
  uint local_1dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  undefined8 local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  OgreImporter *local_1b8;
  aiMaterial *local_1b0;
  undefined1 local_1a8 [376];
  undefined7 uVar6;
  
  local_200 = &local_1f0;
  local_1f8 = 0;
  local_1f0 = 0;
  local_1b8 = this;
  local_1b0 = material;
  std::operator>>((istream *)ss,(string *)&local_200);
  uVar6 = (undefined7)((ulong)unaff_RBP >> 8);
  uVar5 = CONCAT71(uVar6,1);
  if (local_1f8 == DAT_009c40e8) {
    if (local_1f8 == 0) {
      uVar5 = 0;
    }
    else {
      iVar3 = bcmp(local_200,partBlockStart_abi_cxx11_,local_1f8);
      uVar5 = CONCAT71(uVar6,iVar3 != 0);
    }
  }
  if ((char)uVar5 == '\0') {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[13]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [13])" technique \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(techniqueName->_M_dataplus)._M_p,
               techniqueName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar4,local_220._M_dataplus._M_p);
    paVar1 = &local_220.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,
                      CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                               local_220.field_2._M_local_buf[0]) + 1);
    }
    local_1dc = (uint)uVar5;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"pass","");
LAB_0048619c:
    if (local_1f8 == DAT_009c4108) {
      if (local_1f8 == 0) goto LAB_004862f4;
      iVar3 = bcmp(local_200,partBlockEnd_abi_cxx11_,local_1f8);
      if (iVar3 == 0) goto LAB_004862f4;
    }
    std::operator>>((istream *)ss,(string *)&local_200);
    __n = local_1f8;
    if (local_1f8 == DAT_009c40c8) {
      if (local_1f8 != 0) {
        iVar3 = bcmp(local_200,partComment_abi_cxx11_,local_1f8);
        if (iVar3 != 0) goto LAB_0048620a;
      }
      local_1d0 = 0;
      local_1c8._M_local_buf[0] = '\0';
      local_1d8 = &local_1c8;
      cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)ss,(string *)&local_1d8,cVar2);
      if (local_1d8 != &local_1c8) {
        lVar8 = CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]);
        _Var9._M_p = (pointer)local_1d8;
LAB_004862e7:
        operator_delete(_Var9._M_p,lVar8 + 1);
      }
      goto LAB_0048619c;
    }
LAB_0048620a:
    if (__n == local_1a8._8_8_) {
      if (__n != 0) {
        iVar3 = bcmp(local_200,(void *)local_1a8._0_8_,__n);
        if (iVar3 != 0) goto LAB_0048619c;
      }
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      local_220._M_dataplus._M_p = (pointer)paVar1;
      cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
      psVar7 = &local_220;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)ss,(string *)&local_220,cVar2);
      Trim(&local_220,SUB81(psVar7,0));
      ReadPass(local_1b8,&local_220,ss,local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar1) {
        lVar8 = CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                         local_220.field_2._M_local_buf[0]);
        _Var9._M_p = local_220._M_dataplus._M_p;
        goto LAB_004862e7;
      }
    }
    goto LAB_0048619c;
  }
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[60]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [60])"Invalid material: Technique block start missing near index ");
  std::istream::tellg();
  std::ostream::_M_insert<long>((long)local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::error(pLVar4,local_220._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,
                    CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                             local_220.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
LAB_00486322:
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
  }
  return (bool)((byte)uVar5 ^ 1);
LAB_004862f4:
  uVar5 = (ulong)local_1dc;
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  goto LAB_00486322;
}

Assistant:

bool OgreImporter::ReadTechnique(const std::string &techniqueName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Technique block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F(" technique '", techniqueName, "'");

    const string partPass  = "pass";

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        /// @todo Techniques have other attributes than just passes.
        if (linePart == partPass)
        {
            string passName = SkipLine(ss);
            ReadPass(Trim(passName), ss, material);
        }
    }
    return true;
}